

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::Skeleton(Skeleton *this,Mesh *mesh)

{
  Joint *pJVar1;
  Vector3D local_40;
  Mesh *local_18;
  Mesh *mesh_local;
  Skeleton *this_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00394790;
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::vector
            (&this->joints);
  Matrix4x4::Matrix4x4(&this->currentTransformation);
  std::
  map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
  ::map(&this->idToJoint);
  this->mesh = local_18;
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::clear
            (&this->joints);
  Vector3D::Vector3D(&local_40,0.0,0.0,0.0);
  pJVar1 = createNewJoint(this,(Joint *)0x0,&local_40);
  this->root = pJVar1;
  return;
}

Assistant:

Skeleton::Skeleton(Mesh* mesh) {
    this->mesh = mesh;
    joints.clear();
    root = createNewJoint(nullptr, Vector3D(0, 0, 0));
  }